

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O2

void __thiscall
OnDiskDataset::execute(OnDiskDataset *this,Query *query,ResultWriter *out,QueryCounters *counters)

{
  pointer pOVar1;
  FileId *pFVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  QueryCounters *args;
  ResultWriter *pRVar4;
  FileId *pFVar5;
  OnDiskIndex *ndx;
  pointer pOVar6;
  pair<std::__detail::_Node_iterator<IndexType,_true,_false>,_bool> pVar7;
  string_view_t fmt;
  ResultWriter *out_local;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  Query plan;
  QueryResult result;
  unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
  types_to_query;
  
  types_to_query._M_h._M_buckets = &types_to_query._M_h._M_single_bucket;
  types_to_query._M_h._M_bucket_count = 1;
  types_to_query._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  types_to_query._M_h._M_element_count = 0;
  types_to_query._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  types_to_query._M_h._M_rehash_policy._M_next_resize = 0;
  types_to_query._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pOVar1 = (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  args = counters;
  pRVar4 = out;
  out_local = out;
  for (pOVar6 = (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>.
                _M_impl.super__Vector_impl_data._M_start; pOVar6 != pOVar1; pOVar6 = pOVar6 + 1) {
    plan.type = pOVar6->ntype;
    pVar7 = std::
            _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_emplace<IndexType>(&types_to_query._M_h,&plan,pRVar4);
    pRVar4 = pVar7._8_8_;
  }
  Query::plan(&plan,query,&types_to_query);
  q_optimize((Query *)&result,&plan);
  Query::operator=(&plan,(Query *)&result);
  Query::~Query((Query *)&result);
  fmt.size_ = (size_t)&plan;
  fmt.data_ = (char *)0x8;
  spdlog::debug<Query>((spdlog *)"PLAN: {}",fmt,(Query *)args);
  OnDiskDataset::query(&result,this,&plan,counters);
  if (result.has_everything == true) {
    local_118._8_8_ = 0;
    local_118._M_unused._M_object = &out_local;
    local_100 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskDataset.cpp:109:13)>
                ::_M_invoke;
    local_108 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskDataset.cpp:109:13)>
                ::_M_manager;
    OnDiskFileIndex::for_each_filename
              ((OnDiskFileIndex *)&this->files_index,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_118);
    std::_Function_base::~_Function_base((_Function_base *)&local_118);
  }
  else {
    pvVar3 = SortedRun::decompressed(&result.results);
    pFVar2 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pFVar5 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; pFVar5 != pFVar2; pFVar5 = pFVar5 + 1) {
      OnDiskFileIndex::get_file_name_abi_cxx11_
                ((string *)&local_118,(OnDiskFileIndex *)&this->files_index,*pFVar5);
      (**(code **)(*(long *)out + 0x10))(out,&local_118);
      std::__cxx11::string::~string((string *)local_118._M_pod_data);
    }
  }
  SortedRun::~SortedRun(&result.results);
  Query::~Query(&plan);
  std::
  _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&types_to_query._M_h);
  return;
}

Assistant:

void OnDiskDataset::execute(const Query &query, ResultWriter *out,
                            QueryCounters *counters) const {
    std::unordered_set<IndexType> types_to_query;
    for (const auto &ndx : get_indexes()) {
        types_to_query.emplace(ndx.index_type());
    }
    Query plan = query.plan(types_to_query);
    plan = q_optimize(std::move(plan));
    spdlog::debug("PLAN: {}", plan);

    QueryResult result = this->query(plan, counters);
    if (result.is_everything()) {
        files_index->for_each_filename(
            [&out](const std::string &fname) { out->push_back(fname); });
    } else {
        for (const auto &fid : result.vector().decompressed()) {
            out->push_back(get_file_name(fid));
        }
    }
}